

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O0

void universal_action(Architecture *conf)

{
  AddrSpace *pAVar1;
  bool bVar2;
  ActionRestartGroup *this;
  Action *pAVar3;
  ActionExtraPopSetup *this_00;
  ActionPool *pAVar4;
  ActionGroup *pAVar5;
  ActionSegmentize *this_01;
  ActionDirectWrite *pAVar6;
  ActionRestructureVarnode *this_02;
  ActionInferTypes *this_03;
  Rule *pRVar7;
  RulePtrFlow *this_04;
  RuleSubvarSext *this_05;
  reference ppRVar8;
  ActionStackPtrFlow *this_06;
  ActionConstantPtr *this_07;
  allocator local_2051;
  string local_2050 [38];
  undefined1 local_202a;
  allocator local_2029;
  string local_2028 [38];
  undefined1 local_2002;
  allocator local_2001;
  string local_2000 [38];
  undefined1 local_1fda;
  allocator local_1fd9;
  string local_1fd8 [38];
  undefined1 local_1fb2;
  allocator local_1fb1;
  string local_1fb0 [38];
  undefined1 local_1f8a;
  allocator local_1f89;
  string local_1f88 [38];
  undefined1 local_1f62;
  allocator local_1f61;
  string local_1f60 [38];
  undefined1 local_1f3a;
  allocator local_1f39;
  string local_1f38 [38];
  undefined1 local_1f12;
  allocator local_1f11;
  string local_1f10 [38];
  undefined1 local_1eea;
  allocator local_1ee9;
  string local_1ee8 [38];
  undefined1 local_1ec2;
  allocator local_1ec1;
  string local_1ec0 [38];
  undefined1 local_1e9a;
  allocator local_1e99;
  string local_1e98 [38];
  undefined1 local_1e72;
  allocator local_1e71;
  string local_1e70 [38];
  undefined1 local_1e4a;
  allocator local_1e49;
  string local_1e48 [38];
  undefined1 local_1e22;
  allocator local_1e21;
  string local_1e20 [38];
  undefined1 local_1dfa;
  allocator local_1df9;
  string local_1df8 [38];
  undefined1 local_1dd2;
  allocator local_1dd1;
  string local_1dd0 [38];
  undefined1 local_1daa;
  allocator local_1da9;
  string local_1da8 [38];
  undefined1 local_1d82;
  allocator local_1d81;
  string local_1d80 [38];
  undefined1 local_1d5a;
  allocator local_1d59;
  string local_1d58 [38];
  undefined1 local_1d32;
  allocator local_1d31;
  string local_1d30 [38];
  undefined1 local_1d0a;
  allocator local_1d09;
  string local_1d08 [38];
  undefined1 local_1ce2;
  allocator local_1ce1;
  string local_1ce0 [38];
  undefined1 local_1cba;
  allocator local_1cb9;
  string local_1cb8 [38];
  undefined1 local_1c92;
  allocator local_1c91;
  string local_1c90 [38];
  undefined1 local_1c6a;
  allocator local_1c69;
  string local_1c68 [38];
  undefined1 local_1c42;
  allocator local_1c41;
  string local_1c40 [38];
  undefined1 local_1c1a;
  allocator local_1c19;
  string local_1c18 [38];
  undefined1 local_1bf2;
  allocator local_1bf1;
  string local_1bf0 [38];
  undefined1 local_1bca;
  allocator local_1bc9;
  string local_1bc8 [38];
  undefined1 local_1ba2;
  allocator local_1ba1;
  string local_1ba0 [38];
  undefined1 local_1b7a;
  allocator local_1b79;
  string local_1b78 [38];
  undefined1 local_1b52;
  allocator local_1b51;
  string local_1b50 [38];
  undefined1 local_1b2a;
  allocator local_1b29;
  string local_1b28 [38];
  undefined1 local_1b02;
  allocator local_1b01;
  string local_1b00 [38];
  undefined1 local_1ada;
  allocator local_1ad9;
  string local_1ad8 [38];
  undefined1 local_1ab2;
  allocator local_1ab1;
  string local_1ab0 [38];
  undefined1 local_1a8a;
  allocator local_1a89;
  string local_1a88 [38];
  undefined1 local_1a62;
  allocator local_1a61;
  string local_1a60 [38];
  undefined1 local_1a3a;
  allocator local_1a39;
  string local_1a38 [38];
  undefined1 local_1a12;
  allocator local_1a11;
  string local_1a10 [38];
  undefined1 local_19ea;
  allocator local_19e9;
  string local_19e8 [38];
  undefined1 local_19c2;
  allocator local_19c1;
  string local_19c0 [38];
  undefined1 local_199a;
  allocator local_1999;
  string local_1998 [38];
  undefined1 local_1972;
  allocator local_1971;
  string local_1970 [38];
  undefined1 local_194a;
  allocator local_1949;
  string local_1948 [38];
  undefined1 local_1922;
  allocator local_1921;
  string local_1920 [38];
  undefined1 local_18fa;
  allocator local_18f9;
  string local_18f8 [38];
  undefined1 local_18d2;
  allocator local_18d1;
  string local_18d0 [38];
  undefined1 local_18aa;
  allocator local_18a9;
  string local_18a8 [38];
  undefined1 local_1882;
  allocator local_1881;
  string local_1880 [38];
  undefined1 local_185a;
  allocator local_1859;
  string local_1858 [38];
  undefined1 local_1832;
  allocator local_1831;
  string local_1830 [38];
  undefined1 local_180a;
  allocator local_1809;
  string local_1808 [38];
  undefined1 local_17e2;
  allocator local_17e1;
  string local_17e0 [38];
  undefined1 local_17ba;
  allocator local_17b9;
  string local_17b8 [38];
  undefined1 local_1792;
  allocator local_1791;
  string local_1790 [38];
  undefined1 local_176a;
  allocator local_1769;
  string local_1768 [32];
  __normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_> local_1748;
  Rule **local_1740;
  undefined1 local_1732;
  allocator local_1731;
  string local_1730 [38];
  undefined1 local_170a;
  allocator local_1709;
  string local_1708 [38];
  undefined1 local_16e2;
  allocator local_16e1;
  string local_16e0 [38];
  undefined1 local_16ba;
  allocator local_16b9;
  string local_16b8 [38];
  undefined1 local_1692;
  allocator local_1691;
  string local_1690 [38];
  undefined1 local_166a;
  allocator local_1669;
  string local_1668 [38];
  undefined1 local_1642;
  allocator local_1641;
  string local_1640 [38];
  undefined1 local_161a;
  allocator local_1619;
  string local_1618 [38];
  undefined1 local_15f2;
  allocator local_15f1;
  string local_15f0 [38];
  undefined1 local_15ca;
  allocator local_15c9;
  string local_15c8 [38];
  undefined1 local_15a2;
  allocator local_15a1;
  string local_15a0 [38];
  undefined1 local_157a;
  allocator local_1579;
  string local_1578 [38];
  undefined1 local_1552;
  allocator local_1551;
  string local_1550 [38];
  undefined1 local_152a;
  allocator local_1529;
  string local_1528 [38];
  undefined1 local_1502;
  allocator local_1501;
  string local_1500 [38];
  undefined1 local_14da;
  allocator local_14d9;
  string local_14d8 [38];
  undefined1 local_14b2;
  allocator local_14b1;
  string local_14b0 [38];
  undefined1 local_148a;
  allocator local_1489;
  string local_1488 [38];
  undefined1 local_1462;
  allocator local_1461;
  string local_1460 [38];
  undefined1 local_143a;
  allocator local_1439;
  string local_1438 [38];
  undefined1 local_1412;
  allocator local_1411;
  string local_1410 [38];
  undefined1 local_13ea;
  allocator local_13e9;
  string local_13e8 [38];
  undefined1 local_13c2;
  allocator local_13c1;
  string local_13c0 [38];
  undefined1 local_139a;
  allocator local_1399;
  string local_1398 [38];
  undefined1 local_1372;
  allocator local_1371;
  string local_1370 [38];
  undefined1 local_134a;
  allocator local_1349;
  string local_1348 [38];
  undefined1 local_1322;
  allocator local_1321;
  string local_1320 [38];
  undefined1 local_12fa;
  allocator local_12f9;
  string local_12f8 [38];
  undefined1 local_12d2;
  allocator local_12d1;
  string local_12d0 [38];
  undefined1 local_12aa;
  allocator local_12a9;
  string local_12a8 [38];
  undefined1 local_1282;
  allocator local_1281;
  string local_1280 [38];
  undefined1 local_125a;
  allocator local_1259;
  string local_1258 [38];
  undefined1 local_1232;
  allocator local_1231;
  string local_1230 [38];
  undefined1 local_120a;
  allocator local_1209;
  string local_1208 [38];
  undefined1 local_11e2;
  allocator local_11e1;
  string local_11e0 [38];
  undefined1 local_11ba;
  allocator local_11b9;
  string local_11b8 [38];
  undefined1 local_1192;
  allocator local_1191;
  string local_1190 [38];
  undefined1 local_116a;
  allocator local_1169;
  string local_1168 [38];
  undefined1 local_1142;
  allocator local_1141;
  string local_1140 [38];
  undefined1 local_111a;
  allocator local_1119;
  string local_1118 [38];
  undefined1 local_10f2;
  allocator local_10f1;
  string local_10f0 [38];
  undefined1 local_10ca;
  allocator local_10c9;
  string local_10c8 [38];
  undefined1 local_10a2;
  allocator local_10a1;
  string local_10a0 [38];
  undefined1 local_107a;
  allocator local_1079;
  string local_1078 [38];
  undefined1 local_1052;
  allocator local_1051;
  string local_1050 [38];
  undefined1 local_102a;
  allocator local_1029;
  string local_1028 [38];
  undefined1 local_1002;
  allocator local_1001;
  string local_1000 [38];
  undefined1 local_fda;
  allocator local_fd9;
  string local_fd8 [38];
  undefined1 local_fb2;
  allocator local_fb1;
  string local_fb0 [38];
  undefined1 local_f8a;
  allocator local_f89;
  string local_f88 [38];
  undefined1 local_f62;
  allocator local_f61;
  string local_f60 [38];
  undefined1 local_f3a;
  allocator local_f39;
  string local_f38 [38];
  undefined1 local_f12;
  allocator local_f11;
  string local_f10 [38];
  undefined1 local_eea;
  allocator local_ee9;
  string local_ee8 [38];
  undefined1 local_ec2;
  allocator local_ec1;
  string local_ec0 [38];
  undefined1 local_e9a;
  allocator local_e99;
  string local_e98 [38];
  undefined1 local_e72;
  allocator local_e71;
  string local_e70 [38];
  undefined1 local_e4a;
  allocator local_e49;
  string local_e48 [38];
  undefined1 local_e22;
  allocator local_e21;
  string local_e20 [38];
  undefined1 local_dfa;
  allocator local_df9;
  string local_df8 [38];
  undefined1 local_dd2;
  allocator local_dd1;
  string local_dd0 [38];
  undefined1 local_daa;
  allocator local_da9;
  string local_da8 [38];
  undefined1 local_d82;
  allocator local_d81;
  string local_d80 [38];
  undefined1 local_d5a;
  allocator local_d59;
  string local_d58 [38];
  undefined1 local_d32;
  allocator local_d31;
  string local_d30 [38];
  undefined1 local_d0a;
  allocator local_d09;
  string local_d08 [38];
  undefined1 local_ce2;
  allocator local_ce1;
  string local_ce0 [38];
  undefined1 local_cba;
  allocator local_cb9;
  string local_cb8 [38];
  undefined1 local_c92;
  allocator local_c91;
  string local_c90 [38];
  undefined1 local_c6a;
  allocator local_c69;
  string local_c68 [38];
  undefined1 local_c42;
  allocator local_c41;
  string local_c40 [38];
  undefined1 local_c1a;
  allocator local_c19;
  string local_c18 [38];
  undefined1 local_bf2;
  allocator local_bf1;
  string local_bf0 [38];
  undefined1 local_bca;
  allocator local_bc9;
  string local_bc8 [38];
  undefined1 local_ba2;
  allocator local_ba1;
  string local_ba0 [38];
  undefined1 local_b7a;
  allocator local_b79;
  string local_b78 [38];
  undefined1 local_b52;
  allocator local_b51;
  string local_b50 [38];
  undefined1 local_b2a;
  allocator local_b29;
  string local_b28 [38];
  undefined1 local_b02;
  allocator local_b01;
  string local_b00 [38];
  undefined1 local_ada;
  allocator local_ad9;
  string local_ad8 [38];
  undefined1 local_ab2;
  allocator local_ab1;
  string local_ab0 [38];
  undefined1 local_a8a;
  allocator local_a89;
  string local_a88 [38];
  undefined1 local_a62;
  allocator local_a61;
  string local_a60 [38];
  undefined1 local_a3a;
  allocator local_a39;
  string local_a38 [38];
  undefined1 local_a12;
  allocator local_a11;
  string local_a10 [38];
  undefined1 local_9ea;
  allocator local_9e9;
  string local_9e8 [38];
  undefined1 local_9c2;
  allocator local_9c1;
  string local_9c0 [38];
  undefined1 local_99a;
  allocator local_999;
  string local_998 [38];
  undefined1 local_972;
  allocator local_971;
  string local_970 [38];
  undefined1 local_94a;
  allocator local_949;
  string local_948 [38];
  undefined1 local_922;
  allocator local_921;
  string local_920 [38];
  undefined1 local_8fa;
  allocator local_8f9;
  string local_8f8 [38];
  undefined1 local_8d2;
  allocator local_8d1;
  string local_8d0 [38];
  undefined1 local_8aa;
  allocator local_8a9;
  string local_8a8 [38];
  undefined1 local_882;
  allocator local_881;
  string local_880 [38];
  undefined1 local_85a;
  allocator local_859;
  string local_858 [38];
  undefined1 local_832;
  allocator local_831;
  string local_830 [38];
  undefined1 local_80a;
  allocator local_809;
  string local_808 [38];
  undefined1 local_7e2;
  allocator local_7e1;
  string local_7e0 [38];
  undefined1 local_7ba;
  allocator local_7b9;
  string local_7b8 [38];
  undefined1 local_792;
  allocator local_791;
  string local_790 [38];
  undefined1 local_76a;
  allocator local_769;
  string local_768 [38];
  undefined1 local_742;
  allocator local_741;
  string local_740 [38];
  undefined1 local_71a;
  allocator local_719;
  string local_718 [38];
  undefined1 local_6f2;
  allocator local_6f1;
  string local_6f0 [38];
  undefined1 local_6ca;
  allocator local_6c9;
  string local_6c8 [38];
  undefined1 local_6a2;
  allocator local_6a1;
  string local_6a0 [38];
  undefined1 local_67a;
  allocator local_679;
  string local_678 [38];
  undefined1 local_652;
  allocator local_651;
  string local_650 [38];
  undefined1 local_62a;
  allocator local_629;
  string local_628 [38];
  undefined1 local_602;
  allocator local_601;
  string local_600 [38];
  undefined1 local_5da;
  allocator local_5d9;
  string local_5d8 [38];
  undefined1 local_5b2;
  allocator local_5b1;
  string local_5b0 [38];
  undefined1 local_58a;
  allocator local_589;
  string local_588 [38];
  undefined1 local_562;
  allocator local_561;
  string local_560 [38];
  undefined1 local_53a;
  allocator local_539;
  string local_538 [38];
  undefined1 local_512;
  allocator local_511;
  string local_510 [38];
  undefined1 local_4ea;
  allocator local_4e9;
  string local_4e8 [38];
  undefined1 local_4c2;
  allocator local_4c1;
  string local_4c0 [38];
  undefined1 local_49a;
  allocator local_499;
  string local_498 [38];
  undefined1 local_472;
  allocator local_471;
  string local_470 [38];
  undefined1 local_44a;
  allocator local_449;
  string local_448 [38];
  undefined1 local_422;
  allocator local_421;
  string local_420 [38];
  undefined1 local_3fa;
  allocator local_3f9;
  string local_3f8 [38];
  undefined1 local_3d2;
  allocator local_3d1;
  string local_3d0 [38];
  undefined1 local_3aa;
  allocator local_3a9;
  string local_3a8 [38];
  undefined1 local_382;
  allocator local_381;
  string local_380 [38];
  undefined1 local_35a;
  allocator local_359;
  string local_358 [38];
  undefined1 local_332;
  allocator local_331;
  string local_330 [38];
  undefined1 local_30a;
  allocator local_309;
  string local_308 [38];
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [38];
  undefined1 local_2ba;
  allocator local_2b9;
  string local_2b8 [38];
  undefined1 local_292;
  allocator local_291;
  string local_290 [38];
  undefined1 local_26a;
  allocator local_269;
  string local_268 [38];
  undefined1 local_242;
  allocator local_241;
  string local_240 [38];
  undefined1 local_21a;
  allocator local_219;
  string local_218 [38];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [38];
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [38];
  undefined1 local_1a2;
  allocator local_1a1;
  string local_1a0 [38];
  undefined1 local_17a;
  allocator local_179;
  string local_178 [38];
  undefined1 local_152;
  allocator local_151;
  string local_150 [38];
  undefined1 local_12a;
  allocator local_129;
  string local_128 [38];
  undefined1 local_102;
  allocator local_101;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [38];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [35];
  undefined1 local_8d;
  allocator local_79;
  string local_78 [32];
  AddrSpace *local_58;
  AddrSpace *stackspace;
  ActionGroup *actstackstall;
  ActionPool *actcleanup;
  ActionPool *actprop2;
  ActionPool *actprop;
  ActionGroup *actfullloop;
  ActionGroup *actmainloop;
  ActionGroup *act;
  iterator iter;
  Architecture *conf_local;
  
  iter._M_current = (Rule **)conf;
  __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::
  __normal_iterator((__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_> *)
                    &act);
  local_58 = AddrSpaceManager::getStackSpace((AddrSpaceManager *)iter._M_current);
  build_defaultactions((ActionDatabase *)(iter._M_current + 99));
  this = (ActionRestartGroup *)operator_new(0x90);
  local_8d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"universal",&local_79);
  ActionRestartGroup::ActionRestartGroup(this,8,(string *)local_78,1);
  local_8d = 0;
  actmainloop = (ActionGroup *)this;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  ActionDatabase::registerUniversal
            ((ActionDatabase *)(iter._M_current + 99),&actmainloop->super_Action);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"base",&local_b1);
  ActionStart::ActionStart((ActionStart *)pAVar3,(string *)local_b0);
  local_b2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"base",&local_d9);
  ActionConstbase::ActionConstbase((ActionConstbase *)pAVar3,(string *)local_d8);
  local_da = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_102 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"normalanalysis",&local_101);
  ActionNormalizeSetup::ActionNormalizeSetup((ActionNormalizeSetup *)pAVar3,(string *)local_100);
  local_102 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_12a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"base",&local_129);
  ActionDefaultParams::ActionDefaultParams((ActionDefaultParams *)pAVar3,(string *)local_128);
  local_12a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pAVar5 = actmainloop;
  this_00 = (ActionExtraPopSetup *)operator_new(0x70);
  local_152 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"base",&local_151);
  ActionExtraPopSetup::ActionExtraPopSetup(this_00,(string *)local_150,local_58);
  local_152 = 0;
  ActionGroup::addAction(pAVar5,(Action *)this_00);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_17a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"protorecovery",&local_179);
  ActionPrototypeTypes::ActionPrototypeTypes((ActionPrototypeTypes *)pAVar3,(string *)local_178);
  local_17a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"protorecovery",&local_1a1);
  ActionFuncLink::ActionFuncLink((ActionFuncLink *)pAVar3,(string *)local_1a0);
  local_1a2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"noproto",&local_1c9);
  ActionFuncLinkOutOnly::ActionFuncLinkOutOnly((ActionFuncLinkOutOnly *)pAVar3,(string *)local_1c8);
  local_1ca = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  pAVar4 = (ActionPool *)operator_new(0x88);
  local_1f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"fullloop",&local_1f1);
  ActionGroup::ActionGroup((ActionGroup *)pAVar4,4,(string *)local_1f0);
  local_1f2 = 0;
  actprop = pAVar4;
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  pAVar5 = (ActionGroup *)operator_new(0x88);
  local_21a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"mainloop",&local_219);
  ActionGroup::ActionGroup(pAVar5,4,(string *)local_218);
  local_21a = 0;
  actfullloop = pAVar5;
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_242 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"base",&local_241);
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar3,(string *)local_240);
  local_242 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_26a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"base",&local_269);
  ActionVarnodeProps::ActionVarnodeProps((ActionVarnodeProps *)pAVar3,(string *)local_268);
  local_26a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_292 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"base",&local_291);
  ActionHeritage::ActionHeritage((ActionHeritage *)pAVar3,(string *)local_290);
  local_292 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_2ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"protorecovery",&local_2b9);
  ActionParamDouble::ActionParamDouble((ActionParamDouble *)pAVar3,(string *)local_2b8);
  local_2ba = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  pAVar5 = actfullloop;
  this_01 = (ActionSegmentize *)operator_new(0x70);
  local_2e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"base",&local_2e1);
  ActionSegmentize::ActionSegmentize(this_01,(string *)local_2e0);
  local_2e2 = 0;
  ActionGroup::addAction(pAVar5,(Action *)this_01);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_30a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"blockrecovery",&local_309);
  ActionForceGoto::ActionForceGoto((ActionForceGoto *)pAVar3,(string *)local_308);
  local_30a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  pAVar5 = actfullloop;
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_332 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"protorecovery_a",&local_331);
  ActionDirectWrite::ActionDirectWrite(pAVar6,(string *)local_330,true);
  local_332 = 0;
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  pAVar5 = actfullloop;
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_35a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"protorecovery_b",&local_359);
  ActionDirectWrite::ActionDirectWrite(pAVar6,(string *)local_358,false);
  local_35a = 0;
  ActionGroup::addAction(pAVar5,(Action *)pAVar6);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_382 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"protorecovery",&local_381);
  ActionActiveParam::ActionActiveParam((ActionActiveParam *)pAVar3,(string *)local_380);
  local_382 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_3aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"protorecovery",&local_3a9);
  ActionReturnRecovery::ActionReturnRecovery((ActionReturnRecovery *)pAVar3,(string *)local_3a8);
  local_3aa = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_3d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"localrecovery",&local_3d1);
  ActionRestrictLocal::ActionRestrictLocal((ActionRestrictLocal *)pAVar3,(string *)local_3d0);
  local_3d2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_3fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"deadcode",&local_3f9);
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar3,(string *)local_3f8);
  local_3fa = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_422 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"dynamic",&local_421);
  ActionDynamicMapping::ActionDynamicMapping((ActionDynamicMapping *)pAVar3,(string *)local_420);
  local_422 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  pAVar5 = actfullloop;
  this_02 = (ActionRestructureVarnode *)operator_new(0x70);
  local_44a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"localrecovery",&local_449);
  ActionRestructureVarnode::ActionRestructureVarnode(this_02,(string *)local_448);
  local_44a = 0;
  ActionGroup::addAction(pAVar5,(Action *)this_02);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_472 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"base",&local_471);
  ActionSpacebase::ActionSpacebase((ActionSpacebase *)pAVar3,(string *)local_470);
  local_472 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_49a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"analysis",&local_499);
  ActionNonzeroMask::ActionNonzeroMask((ActionNonzeroMask *)pAVar3,(string *)local_498);
  local_49a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  pAVar5 = actfullloop;
  this_03 = (ActionInferTypes *)operator_new(0x70);
  local_4c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c0,"typerecovery",&local_4c1);
  ActionInferTypes::ActionInferTypes(this_03,(string *)local_4c0);
  local_4c2 = 0;
  ActionGroup::addAction(pAVar5,(Action *)this_03);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  pAVar5 = (ActionGroup *)operator_new(0x88);
  local_4ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e8,"stackstall",&local_4e9);
  ActionGroup::ActionGroup(pAVar5,4,(string *)local_4e8);
  local_4ea = 0;
  stackspace = (AddrSpace *)pAVar5;
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  pAVar4 = (ActionPool *)operator_new(0x768);
  local_512 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"oppool1",&local_511);
  ActionPool::ActionPool(pAVar4,4,(string *)local_510);
  local_512 = 0;
  actprop2 = pAVar4;
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_53a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"deadcode",&local_539);
  RuleEarlyRemoval::RuleEarlyRemoval((RuleEarlyRemoval *)pRVar7,(string *)local_538);
  local_53a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_562 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"analysis",&local_561);
  RuleTermOrder::RuleTermOrder((RuleTermOrder *)pRVar7,(string *)local_560);
  local_562 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_58a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"analysis",&local_589);
  RuleSelectCse::RuleSelectCse((RuleSelectCse *)pRVar7,(string *)local_588);
  local_58a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_5b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"analysis",&local_5b1);
  RuleCollectTerms::RuleCollectTerms((RuleCollectTerms *)pRVar7,(string *)local_5b0);
  local_5b2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_5da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"analysis",&local_5d9);
  RulePullsubMulti::RulePullsubMulti((RulePullsubMulti *)pRVar7,(string *)local_5d8);
  local_5da = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_602 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"analysis",&local_601);
  RulePullsubIndirect::RulePullsubIndirect((RulePullsubIndirect *)pRVar7,(string *)local_600);
  local_602 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_62a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"nodejoin",&local_629);
  RulePushMulti::RulePushMulti((RulePushMulti *)pRVar7,(string *)local_628);
  local_62a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_652 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"analysis",&local_651);
  RuleSborrow::RuleSborrow((RuleSborrow *)pRVar7,(string *)local_650);
  local_652 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_67a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_678,"analysis",&local_679);
  RuleIntLessEqual::RuleIntLessEqual((RuleIntLessEqual *)pRVar7,(string *)local_678);
  local_67a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_6a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a0,"analysis",&local_6a1);
  RuleTrivialArith::RuleTrivialArith((RuleTrivialArith *)pRVar7,(string *)local_6a0);
  local_6a2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_6ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"analysis",&local_6c9);
  RuleTrivialBool::RuleTrivialBool((RuleTrivialBool *)pRVar7,(string *)local_6c8);
  local_6ca = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_6f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"analysis",&local_6f1);
  RuleTrivialShift::RuleTrivialShift((RuleTrivialShift *)pRVar7,(string *)local_6f0);
  local_6f2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_71a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"analysis",&local_719);
  RuleSignShift::RuleSignShift((RuleSignShift *)pRVar7,(string *)local_718);
  local_71a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_742 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_740,"analysis",&local_741);
  RuleTestSign::RuleTestSign((RuleTestSign *)pRVar7,(string *)local_740);
  local_742 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_76a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"analysis",&local_769);
  RuleIdentityEl::RuleIdentityEl((RuleIdentityEl *)pRVar7,(string *)local_768);
  local_76a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_792 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"analysis",&local_791);
  RuleOrMask::RuleOrMask((RuleOrMask *)pRVar7,(string *)local_790);
  local_792 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_7ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b8,"analysis",&local_7b9);
  RuleAndMask::RuleAndMask((RuleAndMask *)pRVar7,(string *)local_7b8);
  local_7ba = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_7e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e0,"analysis",&local_7e1);
  RuleOrConsume::RuleOrConsume((RuleOrConsume *)pRVar7,(string *)local_7e0);
  local_7e2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_80a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_808,"analysis",&local_809);
  RuleOrCollapse::RuleOrCollapse((RuleOrCollapse *)pRVar7,(string *)local_808);
  local_80a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_832 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"analysis",&local_831);
  RuleAndOrLump::RuleAndOrLump((RuleAndOrLump *)pRVar7,(string *)local_830);
  local_832 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_85a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"analysis",&local_859);
  RuleShiftBitops::RuleShiftBitops((RuleShiftBitops *)pRVar7,(string *)local_858);
  local_85a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_882 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"analysis",&local_881);
  RuleRightShiftAnd::RuleRightShiftAnd((RuleRightShiftAnd *)pRVar7,(string *)local_880);
  local_882 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_8aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8a8,"analysis",&local_8a9);
  RuleNotDistribute::RuleNotDistribute((RuleNotDistribute *)pRVar7,(string *)local_8a8);
  local_8aa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_8a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_8d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d0,"analysis",&local_8d1);
  RuleHighOrderAnd::RuleHighOrderAnd((RuleHighOrderAnd *)pRVar7,(string *)local_8d0);
  local_8d2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_8d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_8fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"analysis",&local_8f9);
  RuleAndDistribute::RuleAndDistribute((RuleAndDistribute *)pRVar7,(string *)local_8f8);
  local_8fa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_922 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"analysis",&local_921);
  RuleAndCommute::RuleAndCommute((RuleAndCommute *)pRVar7,(string *)local_920);
  local_922 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_94a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_948,"analysis",&local_949);
  RuleAndPiece::RuleAndPiece((RuleAndPiece *)pRVar7,(string *)local_948);
  local_94a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_972 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,"analysis",&local_971);
  RuleAndCompare::RuleAndCompare((RuleAndCompare *)pRVar7,(string *)local_970);
  local_972 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_99a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_998,"analysis",&local_999);
  RuleDoubleSub::RuleDoubleSub((RuleDoubleSub *)pRVar7,(string *)local_998);
  local_99a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_998);
  std::allocator<char>::~allocator((allocator<char> *)&local_999);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_9c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"analysis",&local_9c1);
  RuleDoubleShift::RuleDoubleShift((RuleDoubleShift *)pRVar7,(string *)local_9c0);
  local_9c2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_9ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"analysis",&local_9e9);
  RuleDoubleArithShift::RuleDoubleArithShift((RuleDoubleArithShift *)pRVar7,(string *)local_9e8);
  local_9ea = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_a12 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"analysis",&local_a11);
  RuleConcatShift::RuleConcatShift((RuleConcatShift *)pRVar7,(string *)local_a10);
  local_a12 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_a3a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a38,"analysis",&local_a39);
  RuleLeftRight::RuleLeftRight((RuleLeftRight *)pRVar7,(string *)local_a38);
  local_a3a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_a39);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_a62 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a60,"analysis",&local_a61);
  RuleShiftCompare::RuleShiftCompare((RuleShiftCompare *)pRVar7,(string *)local_a60);
  local_a62 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_a8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a88,"analysis",&local_a89);
  RuleShift2Mult::RuleShift2Mult((RuleShift2Mult *)pRVar7,(string *)local_a88);
  local_a8a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_ab2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab0,"analysis",&local_ab1);
  RuleShiftPiece::RuleShiftPiece((RuleShiftPiece *)pRVar7,(string *)local_ab0);
  local_ab2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_ada = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"analysis",&local_ad9);
  RuleMultiCollapse::RuleMultiCollapse((RuleMultiCollapse *)pRVar7,(string *)local_ad8);
  local_ada = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_b02 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"analysis",&local_b01);
  RuleIndirectCollapse::RuleIndirectCollapse((RuleIndirectCollapse *)pRVar7,(string *)local_b00);
  local_b02 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_b2a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"analysis",&local_b29);
  Rule2Comp2Mult::Rule2Comp2Mult((Rule2Comp2Mult *)pRVar7,(string *)local_b28);
  local_b2a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_b52 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b50,"analysis",&local_b51);
  RuleSub2Add::RuleSub2Add((RuleSub2Add *)pRVar7,(string *)local_b50);
  local_b52 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_b51);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_b7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b78,"analysis",&local_b79);
  RuleCarryElim::RuleCarryElim((RuleCarryElim *)pRVar7,(string *)local_b78);
  local_b7a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_b79);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_ba2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"analysis",&local_ba1);
  RuleBxor2NotEqual::RuleBxor2NotEqual((RuleBxor2NotEqual *)pRVar7,(string *)local_ba0);
  local_ba2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_bca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"analysis",&local_bc9);
  RuleLess2Zero::RuleLess2Zero((RuleLess2Zero *)pRVar7,(string *)local_bc8);
  local_bca = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_bf2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"analysis",&local_bf1);
  RuleLessEqual2Zero::RuleLessEqual2Zero((RuleLessEqual2Zero *)pRVar7,(string *)local_bf0);
  local_bf2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_c1a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c18,"analysis",&local_c19);
  RuleSLess2Zero::RuleSLess2Zero((RuleSLess2Zero *)pRVar7,(string *)local_c18);
  local_c1a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_c19);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_c42 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c40,"analysis",&local_c41);
  RuleEqual2Zero::RuleEqual2Zero((RuleEqual2Zero *)pRVar7,(string *)local_c40);
  local_c42 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_c6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c68,"analysis",&local_c69);
  RuleEqual2Constant::RuleEqual2Constant((RuleEqual2Constant *)pRVar7,(string *)local_c68);
  local_c6a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_c69);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_c92 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c90,"analysis",&local_c91);
  RuleThreeWayCompare::RuleThreeWayCompare((RuleThreeWayCompare *)pRVar7,(string *)local_c90);
  local_c92 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_c91);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_cba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"analysis",&local_cb9);
  RuleXorCollapse::RuleXorCollapse((RuleXorCollapse *)pRVar7,(string *)local_cb8);
  local_cba = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_ce2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"analysis",&local_ce1);
  RuleAddMultCollapse::RuleAddMultCollapse((RuleAddMultCollapse *)pRVar7,(string *)local_ce0);
  local_ce2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_d0a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d08,"analysis",&local_d09);
  RuleCollapseConstants::RuleCollapseConstants((RuleCollapseConstants *)pRVar7,(string *)local_d08);
  local_d0a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_d32 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d30,"analysis",&local_d31);
  RuleTransformCpool::RuleTransformCpool((RuleTransformCpool *)pRVar7,(string *)local_d30);
  local_d32 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_d5a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d58,"analysis",&local_d59);
  RulePropagateCopy::RulePropagateCopy((RulePropagateCopy *)pRVar7,(string *)local_d58);
  local_d5a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_d82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d80,"analysis",&local_d81);
  RuleZextEliminate::RuleZextEliminate((RuleZextEliminate *)pRVar7,(string *)local_d80);
  local_d82 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_daa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da8,"analysis",&local_da9);
  RuleSlessToLess::RuleSlessToLess((RuleSlessToLess *)pRVar7,(string *)local_da8);
  local_daa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_da9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_dd2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd0,"analysis",&local_dd1);
  RuleZextSless::RuleZextSless((RuleZextSless *)pRVar7,(string *)local_dd0);
  local_dd2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_dfa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"analysis",&local_df9);
  RuleBitUndistribute::RuleBitUndistribute((RuleBitUndistribute *)pRVar7,(string *)local_df8);
  local_dfa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_e22 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"analysis",&local_e21);
  RuleBoolZext::RuleBoolZext((RuleBoolZext *)pRVar7,(string *)local_e20);
  local_e22 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_e4a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e48,"analysis",&local_e49);
  RuleBooleanNegate::RuleBooleanNegate((RuleBooleanNegate *)pRVar7,(string *)local_e48);
  local_e4a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_e49);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_e72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e70,"analysis",&local_e71);
  RuleLogic2Bool::RuleLogic2Bool((RuleLogic2Bool *)pRVar7,(string *)local_e70);
  local_e72 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_e9a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e98,"analysis",&local_e99);
  RuleSubExtComm::RuleSubExtComm((RuleSubExtComm *)pRVar7,(string *)local_e98);
  local_e9a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_e98);
  std::allocator<char>::~allocator((allocator<char> *)&local_e99);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_ec2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec0,"analysis",&local_ec1);
  RuleSubCommute::RuleSubCommute((RuleSubCommute *)pRVar7,(string *)local_ec0);
  local_ec2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_eea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ee8,"analysis",&local_ee9);
  RuleConcatCommute::RuleConcatCommute((RuleConcatCommute *)pRVar7,(string *)local_ee8);
  local_eea = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ee9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_f12 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f10,"analysis",&local_f11);
  RuleConcatZext::RuleConcatZext((RuleConcatZext *)pRVar7,(string *)local_f10);
  local_f12 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_f11);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_f3a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"analysis",&local_f39);
  RuleZextCommute::RuleZextCommute((RuleZextCommute *)pRVar7,(string *)local_f38);
  local_f3a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_f62 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f60,"analysis",&local_f61);
  RuleZextShiftZext::RuleZextShiftZext((RuleZextShiftZext *)pRVar7,(string *)local_f60);
  local_f62 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_f8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f88,"analysis",&local_f89);
  RuleShiftAnd::RuleShiftAnd((RuleShiftAnd *)pRVar7,(string *)local_f88);
  local_f8a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_f89);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_fb2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb0,"analysis",&local_fb1);
  RuleConcatZero::RuleConcatZero((RuleConcatZero *)pRVar7,(string *)local_fb0);
  local_fb2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_fda = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fd8,"analysis",&local_fd9);
  RuleConcatLeftShift::RuleConcatLeftShift((RuleConcatLeftShift *)pRVar7,(string *)local_fd8);
  local_fda = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1002 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1000,"analysis",&local_1001);
  RuleEmbed::RuleEmbed((RuleEmbed *)pRVar7,(string *)local_1000);
  local_1002 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_102a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1028,"analysis",&local_1029);
  RuleSubZext::RuleSubZext((RuleSubZext *)pRVar7,(string *)local_1028);
  local_102a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1028);
  std::allocator<char>::~allocator((allocator<char> *)&local_1029);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1052 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1050,"analysis",&local_1051);
  RuleSubCancel::RuleSubCancel((RuleSubCancel *)pRVar7,(string *)local_1050);
  local_1052 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1050);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_107a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1078,"analysis",&local_1079);
  RuleShiftSub::RuleShiftSub((RuleShiftSub *)pRVar7,(string *)local_1078);
  local_107a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1078);
  std::allocator<char>::~allocator((allocator<char> *)&local_1079);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_10a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10a0,"analysis",&local_10a1);
  RuleHumptyDumpty::RuleHumptyDumpty((RuleHumptyDumpty *)pRVar7,(string *)local_10a0);
  local_10a2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_10a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_10ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c8,"analysis",&local_10c9);
  RuleDumptyHump::RuleDumptyHump((RuleDumptyHump *)pRVar7,(string *)local_10c8);
  local_10ca = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_10c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_10f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10f0,"analysis",&local_10f1);
  RuleHumptyOr::RuleHumptyOr((RuleHumptyOr *)pRVar7,(string *)local_10f0);
  local_10f2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_10f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_111a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1118,"analysis",&local_1119);
  RuleNegateIdentity::RuleNegateIdentity((RuleNegateIdentity *)pRVar7,(string *)local_1118);
  local_111a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1118);
  std::allocator<char>::~allocator((allocator<char> *)&local_1119);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1142 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1140,"analysis",&local_1141);
  RuleSubNormal::RuleSubNormal((RuleSubNormal *)pRVar7,(string *)local_1140);
  local_1142 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1140);
  std::allocator<char>::~allocator((allocator<char> *)&local_1141);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_116a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1168,"analysis",&local_1169);
  RulePositiveDiv::RulePositiveDiv((RulePositiveDiv *)pRVar7,(string *)local_1168);
  local_116a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1168);
  std::allocator<char>::~allocator((allocator<char> *)&local_1169);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1192 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1190,"analysis",&local_1191);
  RuleDivTermAdd::RuleDivTermAdd((RuleDivTermAdd *)pRVar7,(string *)local_1190);
  local_1192 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1190);
  std::allocator<char>::~allocator((allocator<char> *)&local_1191);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_11ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11b8,"analysis",&local_11b9);
  RuleDivTermAdd2::RuleDivTermAdd2((RuleDivTermAdd2 *)pRVar7,(string *)local_11b8);
  local_11ba = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_11b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11b9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_11e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11e0,"analysis",&local_11e1);
  RuleDivOpt::RuleDivOpt((RuleDivOpt *)pRVar7,(string *)local_11e0);
  local_11e2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_11e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_120a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1208,"analysis",&local_1209);
  RuleSignForm::RuleSignForm((RuleSignForm *)pRVar7,(string *)local_1208);
  local_120a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1232 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1230,"analysis",&local_1231);
  RuleSignDiv2::RuleSignDiv2((RuleSignDiv2 *)pRVar7,(string *)local_1230);
  local_1232 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1230);
  std::allocator<char>::~allocator((allocator<char> *)&local_1231);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_125a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1258,"analysis",&local_1259);
  RuleSignNearMult::RuleSignNearMult((RuleSignNearMult *)pRVar7,(string *)local_1258);
  local_125a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1258);
  std::allocator<char>::~allocator((allocator<char> *)&local_1259);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1282 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1280,"analysis",&local_1281);
  RuleModOpt::RuleModOpt((RuleModOpt *)pRVar7,(string *)local_1280);
  local_1282 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1280);
  std::allocator<char>::~allocator((allocator<char> *)&local_1281);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_12aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12a8,"analysis",&local_12a9);
  RuleSwitchSingle::RuleSwitchSingle((RuleSwitchSingle *)pRVar7,(string *)local_12a8);
  local_12aa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_12a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_12d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12d0,"analysis",&local_12d1);
  RuleCondNegate::RuleCondNegate((RuleCondNegate *)pRVar7,(string *)local_12d0);
  local_12d2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_12d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_12fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"analysis",&local_12f9);
  RuleBoolNegate::RuleBoolNegate((RuleBoolNegate *)pRVar7,(string *)local_12f8);
  local_12fa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1322 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1320,"analysis",&local_1321);
  RuleLessEqual::RuleLessEqual((RuleLessEqual *)pRVar7,(string *)local_1320);
  local_1322 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1320);
  std::allocator<char>::~allocator((allocator<char> *)&local_1321);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_134a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1348,"analysis",&local_1349);
  RuleLessNotEqual::RuleLessNotEqual((RuleLessNotEqual *)pRVar7,(string *)local_1348);
  local_134a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1348);
  std::allocator<char>::~allocator((allocator<char> *)&local_1349);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1372 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1370,"analysis",&local_1371);
  RuleLessOne::RuleLessOne((RuleLessOne *)pRVar7,(string *)local_1370);
  local_1372 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1370);
  std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_139a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"analysis",&local_1399);
  RuleRangeMeld::RuleRangeMeld((RuleRangeMeld *)pRVar7,(string *)local_1398);
  local_139a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_13c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c0,"analysis",&local_13c1);
  RuleFloatRange::RuleFloatRange((RuleFloatRange *)pRVar7,(string *)local_13c0);
  local_13c2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_13ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13e8,"analysis",&local_13e9);
  RulePiece2Zext::RulePiece2Zext((RulePiece2Zext *)pRVar7,(string *)local_13e8);
  local_13ea = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_13e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1412 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1410,"analysis",&local_1411);
  RulePiece2Sext::RulePiece2Sext((RulePiece2Sext *)pRVar7,(string *)local_1410);
  local_1412 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1410);
  std::allocator<char>::~allocator((allocator<char> *)&local_1411);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_143a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1438,"subvar",&local_1439);
  RuleSubvarAnd::RuleSubvarAnd((RuleSubvarAnd *)pRVar7,(string *)local_1438);
  local_143a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1438);
  std::allocator<char>::~allocator((allocator<char> *)&local_1439);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1462 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1460,"subvar",&local_1461);
  RuleSubvarSubpiece::RuleSubvarSubpiece((RuleSubvarSubpiece *)pRVar7,(string *)local_1460);
  local_1462 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_148a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1488,"subvar",&local_1489);
  RuleSplitFlow::RuleSplitFlow((RuleSplitFlow *)pRVar7,(string *)local_1488);
  local_148a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1488);
  std::allocator<char>::~allocator((allocator<char> *)&local_1489);
  pAVar4 = actprop2;
  this_04 = (RulePtrFlow *)operator_new(0x68);
  local_14b2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14b0,"subvar",&local_14b1);
  RulePtrFlow::RulePtrFlow(this_04,(string *)local_14b0,(Architecture *)iter._M_current);
  local_14b2 = 0;
  ActionPool::addRule(pAVar4,(Rule *)this_04);
  std::__cxx11::string::~string(local_14b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_14da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14d8,"subvar",&local_14d9);
  RuleSubvarCompZero::RuleSubvarCompZero((RuleSubvarCompZero *)pRVar7,(string *)local_14d8);
  local_14da = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_14d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14d9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1502 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1500,"subvar",&local_1501);
  RuleSubvarShift::RuleSubvarShift((RuleSubvarShift *)pRVar7,(string *)local_1500);
  local_1502 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator((allocator<char> *)&local_1501);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_152a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1528,"subvar",&local_1529);
  RuleSubvarZext::RuleSubvarZext((RuleSubvarZext *)pRVar7,(string *)local_1528);
  local_152a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1528);
  std::allocator<char>::~allocator((allocator<char> *)&local_1529);
  pAVar4 = actprop2;
  this_05 = (RuleSubvarSext *)operator_new(0x60);
  local_1552 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1550,"subvar",&local_1551);
  RuleSubvarSext::RuleSubvarSext(this_05,(string *)local_1550);
  local_1552 = 0;
  ActionPool::addRule(pAVar4,(Rule *)this_05);
  std::__cxx11::string::~string(local_1550);
  std::allocator<char>::~allocator((allocator<char> *)&local_1551);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_157a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1578,"analysis",&local_1579);
  RuleNegateNegate::RuleNegateNegate((RuleNegateNegate *)pRVar7,(string *)local_1578);
  local_157a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1578);
  std::allocator<char>::~allocator((allocator<char> *)&local_1579);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_15a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15a0,"conditionalexe",&local_15a1);
  RuleConditionalMove::RuleConditionalMove((RuleConditionalMove *)pRVar7,(string *)local_15a0);
  local_15a2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_15ca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15c8,"conditionalexe",&local_15c9);
  RuleOrPredicate::RuleOrPredicate((RuleOrPredicate *)pRVar7,(string *)local_15c8);
  local_15ca = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_15c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15c9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_15f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15f0,"analysis",&local_15f1);
  RuleFuncPtrEncoding::RuleFuncPtrEncoding((RuleFuncPtrEncoding *)pRVar7,(string *)local_15f0);
  local_15f2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_161a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1618,"floatprecision",&local_1619);
  RuleSubfloatConvert::RuleSubfloatConvert((RuleSubfloatConvert *)pRVar7,(string *)local_1618);
  local_161a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1642 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1640,"floatprecision",&local_1641);
  RuleFloatCast::RuleFloatCast((RuleFloatCast *)pRVar7,(string *)local_1640);
  local_1642 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1640);
  std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_166a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1668,"floatprecision",&local_1669);
  RuleIgnoreNan::RuleIgnoreNan((RuleIgnoreNan *)pRVar7,(string *)local_1668);
  local_166a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1668);
  std::allocator<char>::~allocator((allocator<char> *)&local_1669);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1692 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1690,"typerecovery",&local_1691);
  RulePtraddUndo::RulePtraddUndo((RulePtraddUndo *)pRVar7,(string *)local_1690);
  local_1692 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1690);
  std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_16ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16b8,"typerecovery",&local_16b9);
  RulePtrsubUndo::RulePtrsubUndo((RulePtrsubUndo *)pRVar7,(string *)local_16b8);
  local_16ba = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_16b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_16e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16e0,"segment",&local_16e1);
  RuleSegment::RuleSegment((RuleSegment *)pRVar7,(string *)local_16e0);
  local_16e2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16e1);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_170a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1708,"doubleload",&local_1709);
  RuleDoubleLoad::RuleDoubleLoad((RuleDoubleLoad *)pRVar7,(string *)local_1708);
  local_170a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1708);
  std::allocator<char>::~allocator((allocator<char> *)&local_1709);
  pAVar4 = actprop2;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1732 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1730,"doubleprecis",&local_1731);
  RuleDoubleIn::RuleDoubleIn((RuleDoubleIn *)pRVar7,(string *)local_1730);
  local_1732 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1730);
  std::allocator<char>::~allocator((allocator<char> *)&local_1731);
  local_1740 = (Rule **)std::vector<Rule_*,_std::allocator<Rule_*>_>::begin
                                  ((vector<Rule_*,_std::allocator<Rule_*>_> *)
                                   (iter._M_current + 0x2d));
  act = (ActionGroup *)local_1740;
  while( true ) {
    local_1748._M_current =
         (Rule **)std::vector<Rule_*,_std::allocator<Rule_*>_>::end
                            ((vector<Rule_*,_std::allocator<Rule_*>_> *)(iter._M_current + 0x2d));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_> *)
                       &act,&local_1748);
    pAVar4 = actprop2;
    if (!bVar2) break;
    ppRVar8 = __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::
              operator*((__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_> *
                        )&act);
    ActionPool::addRule(pAVar4,*ppRVar8);
    __gnu_cxx::__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_>::operator++
              ((__normal_iterator<Rule_**,_std::vector<Rule_*,_std::allocator<Rule_*>_>_> *)&act);
  }
  std::vector<Rule_*,_std::allocator<Rule_*>_>::clear
            ((vector<Rule_*,_std::allocator<Rule_*>_> *)(iter._M_current + 0x2d));
  ActionGroup::addAction((ActionGroup *)stackspace,&actprop2->super_Action);
  pAVar1 = stackspace;
  pAVar3 = (Action *)operator_new(0x68);
  local_176a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1768,"analysis",&local_1769);
  ActionMultiCse::ActionMultiCse((ActionMultiCse *)pAVar3,(string *)local_1768);
  local_176a = 0;
  ActionGroup::addAction((ActionGroup *)pAVar1,pAVar3);
  std::__cxx11::string::~string(local_1768);
  std::allocator<char>::~allocator((allocator<char> *)&local_1769);
  pAVar1 = stackspace;
  pAVar3 = (Action *)operator_new(0x68);
  local_1792 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1790,"analysis",&local_1791);
  ActionShadowVar::ActionShadowVar((ActionShadowVar *)pAVar3,(string *)local_1790);
  local_1792 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar1,pAVar3);
  std::__cxx11::string::~string(local_1790);
  std::allocator<char>::~allocator((allocator<char> *)&local_1791);
  pAVar1 = stackspace;
  pAVar3 = (Action *)operator_new(0x68);
  local_17ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b8,"deindirect",&local_17b9);
  ActionDeindirect::ActionDeindirect((ActionDeindirect *)pAVar3,(string *)local_17b8);
  local_17ba = 0;
  ActionGroup::addAction((ActionGroup *)pAVar1,pAVar3);
  std::__cxx11::string::~string(local_17b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b9);
  pAVar1 = stackspace;
  this_06 = (ActionStackPtrFlow *)operator_new(0x78);
  local_17e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17e0,"stackptrflow",&local_17e1);
  ActionStackPtrFlow::ActionStackPtrFlow(this_06,(string *)local_17e0,local_58);
  local_17e2 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar1,(Action *)this_06);
  std::__cxx11::string::~string(local_17e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17e1);
  ActionGroup::addAction(actfullloop,(Action *)stackspace);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_180a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1808,"deadcontrolflow",&local_1809);
  ActionRedundBranch::ActionRedundBranch((ActionRedundBranch *)pAVar3,(string *)local_1808);
  local_180a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1808);
  std::allocator<char>::~allocator((allocator<char> *)&local_1809);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1832 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1830,"blockrecovery",&local_1831);
  ActionBlockStructure::ActionBlockStructure((ActionBlockStructure *)pAVar3,(string *)local_1830);
  local_1832 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1830);
  std::allocator<char>::~allocator((allocator<char> *)&local_1831);
  pAVar5 = actfullloop;
  this_07 = (ActionConstantPtr *)operator_new(0x70);
  local_185a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1858,"typerecovery",&local_1859);
  ActionConstantPtr::ActionConstantPtr(this_07,(string *)local_1858);
  local_185a = 0;
  ActionGroup::addAction(pAVar5,(Action *)this_07);
  std::__cxx11::string::~string(local_1858);
  std::allocator<char>::~allocator((allocator<char> *)&local_1859);
  pAVar4 = (ActionPool *)operator_new(0x768);
  local_1882 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1880,"oppool2",&local_1881);
  ActionPool::ActionPool(pAVar4,4,(string *)local_1880);
  local_1882 = 0;
  actcleanup = pAVar4;
  std::__cxx11::string::~string(local_1880);
  std::allocator<char>::~allocator((allocator<char> *)&local_1881);
  pAVar4 = actcleanup;
  pRVar7 = (Rule *)operator_new(0x58);
  local_18aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18a8,"typerecovery",&local_18a9);
  RulePushPtr::RulePushPtr((RulePushPtr *)pRVar7,(string *)local_18a8);
  local_18aa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_18a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18a9);
  pAVar4 = actcleanup;
  pRVar7 = (Rule *)operator_new(0x58);
  local_18d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18d0,"typerecovery",&local_18d1);
  RuleStructOffset0::RuleStructOffset0((RuleStructOffset0 *)pRVar7,(string *)local_18d0);
  local_18d2 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_18d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_18d1);
  pAVar4 = actcleanup;
  pRVar7 = (Rule *)operator_new(0x58);
  local_18fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_18f8,"typerecovery",&local_18f9);
  RulePtrArith::RulePtrArith((RulePtrArith *)pRVar7,(string *)local_18f8);
  local_18fa = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_18f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_18f9);
  pAVar4 = actcleanup;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1922 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1920,"stackvars",&local_1921);
  RuleLoadVarnode::RuleLoadVarnode((RuleLoadVarnode *)pRVar7,(string *)local_1920);
  local_1922 = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1920);
  std::allocator<char>::~allocator((allocator<char> *)&local_1921);
  pAVar4 = actcleanup;
  pRVar7 = (Rule *)operator_new(0x58);
  local_194a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1948,"stackvars",&local_1949);
  RuleStoreVarnode::RuleStoreVarnode((RuleStoreVarnode *)pRVar7,(string *)local_1948);
  local_194a = 0;
  ActionPool::addRule(pAVar4,pRVar7);
  std::__cxx11::string::~string(local_1948);
  std::allocator<char>::~allocator((allocator<char> *)&local_1949);
  ActionGroup::addAction(actfullloop,&actcleanup->super_Action);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1972 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1970,"unreachable",&local_1971);
  ActionDeterminedBranch::ActionDeterminedBranch
            ((ActionDeterminedBranch *)pAVar3,(string *)local_1970);
  local_1972 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1970);
  std::allocator<char>::~allocator((allocator<char> *)&local_1971);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_199a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1998,"unreachable",&local_1999);
  ActionUnreachable::ActionUnreachable((ActionUnreachable *)pAVar3,(string *)local_1998);
  local_199a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1998);
  std::allocator<char>::~allocator((allocator<char> *)&local_1999);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_19c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19c0,"nodejoin",&local_19c1);
  ActionNodeJoin::ActionNodeJoin((ActionNodeJoin *)pAVar3,(string *)local_19c0);
  local_19c2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_19c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_19c1);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_19ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_19e8,"conditionalexe",&local_19e9);
  ActionConditionalExe::ActionConditionalExe((ActionConditionalExe *)pAVar3,(string *)local_19e8);
  local_19ea = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_19e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_19e9);
  pAVar5 = actfullloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1a12 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a10,"analysis",&local_1a11);
  ActionConditionalConst::ActionConditionalConst
            ((ActionConditionalConst *)pAVar3,(string *)local_1a10);
  local_1a12 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a11);
  ActionGroup::addAction((ActionGroup *)actprop,&actfullloop->super_Action);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1a3a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a38,"protorecovery",&local_1a39);
  ActionLikelyTrash::ActionLikelyTrash((ActionLikelyTrash *)pAVar3,(string *)local_1a38);
  local_1a3a = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1a38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a39);
  pAVar4 = actprop;
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_1a62 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a60,"protorecovery_a",&local_1a61);
  ActionDirectWrite::ActionDirectWrite(pAVar6,(string *)local_1a60,true);
  local_1a62 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,(Action *)pAVar6);
  std::__cxx11::string::~string(local_1a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a61);
  pAVar4 = actprop;
  pAVar6 = (ActionDirectWrite *)operator_new(0x70);
  local_1a8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a88,"protorecovery_b",&local_1a89);
  ActionDirectWrite::ActionDirectWrite(pAVar6,(string *)local_1a88,false);
  local_1a8a = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,(Action *)pAVar6);
  std::__cxx11::string::~string(local_1a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a89);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ab2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ab0,"deadcode",&local_1ab1);
  ActionDeadCode::ActionDeadCode((ActionDeadCode *)pAVar3,(string *)local_1ab0);
  local_1ab2 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ada = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ad8,"deadcontrolflow",&local_1ad9);
  ActionDoNothing::ActionDoNothing((ActionDoNothing *)pAVar3,(string *)local_1ad8);
  local_1ada = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ad9);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1b02 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b00,"switchnorm",&local_1b01);
  ActionSwitchNorm::ActionSwitchNorm((ActionSwitchNorm *)pAVar3,(string *)local_1b00);
  local_1b02 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b01);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1b2a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b28,"returnsplit",&local_1b29);
  ActionReturnSplit::ActionReturnSplit((ActionReturnSplit *)pAVar3,(string *)local_1b28);
  local_1b2a = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1b52 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b50,"protorecovery",&local_1b51);
  ActionUnjustifiedParams::ActionUnjustifiedParams
            ((ActionUnjustifiedParams *)pAVar3,(string *)local_1b50);
  local_1b52 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1b50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b51);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1b7a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b78,"typerecovery",&local_1b79);
  ActionStartTypes::ActionStartTypes((ActionStartTypes *)pAVar3,(string *)local_1b78);
  local_1b7a = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1b78);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b79);
  pAVar4 = actprop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ba2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ba0,"protorecovery",&local_1ba1);
  ActionActiveReturn::ActionActiveReturn((ActionActiveReturn *)pAVar3,(string *)local_1ba0);
  local_1ba2 = 0;
  ActionGroup::addAction((ActionGroup *)pAVar4,pAVar3);
  std::__cxx11::string::~string(local_1ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ba1);
  ActionGroup::addAction(actmainloop,&actprop->super_Action);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1bca = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bc8,"cleanup",&local_1bc9);
  ActionStartCleanUp::ActionStartCleanUp((ActionStartCleanUp *)pAVar3,(string *)local_1bc8);
  local_1bca = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  pAVar4 = (ActionPool *)operator_new(0x768);
  local_1bf2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bf0,"cleanup",&local_1bf1);
  ActionPool::ActionPool(pAVar4,4,(string *)local_1bf0);
  local_1bf2 = 0;
  actstackstall = (ActionGroup *)pAVar4;
  std::__cxx11::string::~string(local_1bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bf1);
  pAVar5 = actstackstall;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1c1a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c18,"cleanup",&local_1c19);
  RuleMultNegOne::RuleMultNegOne((RuleMultNegOne *)pRVar7,(string *)local_1c18);
  local_1c1a = 0;
  ActionPool::addRule((ActionPool *)pAVar5,pRVar7);
  std::__cxx11::string::~string(local_1c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c19);
  pAVar5 = actstackstall;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1c42 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c40,"cleanup",&local_1c41);
  RuleAddUnsigned::RuleAddUnsigned((RuleAddUnsigned *)pRVar7,(string *)local_1c40);
  local_1c42 = 0;
  ActionPool::addRule((ActionPool *)pAVar5,pRVar7);
  std::__cxx11::string::~string(local_1c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c41);
  pAVar5 = actstackstall;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1c6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c68,"cleanup",&local_1c69);
  Rule2Comp2Sub::Rule2Comp2Sub((Rule2Comp2Sub *)pRVar7,(string *)local_1c68);
  local_1c6a = 0;
  ActionPool::addRule((ActionPool *)pAVar5,pRVar7);
  std::__cxx11::string::~string(local_1c68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c69);
  pAVar5 = actstackstall;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1c92 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c90,"cleanup",&local_1c91);
  RuleSubRight::RuleSubRight((RuleSubRight *)pRVar7,(string *)local_1c90);
  local_1c92 = 0;
  ActionPool::addRule((ActionPool *)pAVar5,pRVar7);
  std::__cxx11::string::~string(local_1c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
  pAVar5 = actstackstall;
  pRVar7 = (Rule *)operator_new(0x58);
  local_1cba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1cb8,"cleanup",&local_1cb9);
  RulePtrsubCharConstant::RulePtrsubCharConstant
            ((RulePtrsubCharConstant *)pRVar7,(string *)local_1cb8);
  local_1cba = 0;
  ActionPool::addRule((ActionPool *)pAVar5,pRVar7);
  std::__cxx11::string::~string(local_1cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1cb9);
  ActionGroup::addAction(actmainloop,&actstackstall->super_Action);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ce2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ce0,"blockrecovery",&local_1ce1);
  ActionPreferComplement::ActionPreferComplement
            ((ActionPreferComplement *)pAVar3,(string *)local_1ce0);
  local_1ce2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ce1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1d0a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d08,"normalizebranches",&local_1d09);
  ActionNormalizeBranches::ActionNormalizeBranches
            ((ActionNormalizeBranches *)pAVar3,(string *)local_1d08);
  local_1d0a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d09);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1d32 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d30,"merge",&local_1d31);
  ActionAssignHigh::ActionAssignHigh((ActionAssignHigh *)pAVar3,(string *)local_1d30);
  local_1d32 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d31);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1d5a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d58,"merge",&local_1d59);
  ActionMergeRequired::ActionMergeRequired((ActionMergeRequired *)pAVar3,(string *)local_1d58);
  local_1d5a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d59);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1d82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d80,"merge",&local_1d81);
  ActionMarkExplicit::ActionMarkExplicit((ActionMarkExplicit *)pAVar3,(string *)local_1d80);
  local_1d82 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d81);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1daa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1da8,"merge",&local_1da9);
  ActionMarkImplied::ActionMarkImplied((ActionMarkImplied *)pAVar3,(string *)local_1da8);
  local_1daa = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1da9);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1dd2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1dd0,"merge",&local_1dd1);
  ActionMergeCopy::ActionMergeCopy((ActionMergeCopy *)pAVar3,(string *)local_1dd0);
  local_1dd2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1dfa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1df8,"merge",&local_1df9);
  ActionDominantCopy::ActionDominantCopy((ActionDominantCopy *)pAVar3,(string *)local_1df8);
  local_1dfa = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1df9);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1e22 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e20,"merge",&local_1e21);
  ActionMarkIndirectOnly::ActionMarkIndirectOnly
            ((ActionMarkIndirectOnly *)pAVar3,(string *)local_1e20);
  local_1e22 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e21);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1e4a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e48,"merge",&local_1e49);
  ActionMergeAdjacent::ActionMergeAdjacent((ActionMergeAdjacent *)pAVar3,(string *)local_1e48);
  local_1e4a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e49);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1e72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e70,"merge",&local_1e71);
  ActionMergeType::ActionMergeType((ActionMergeType *)pAVar3,(string *)local_1e70);
  local_1e72 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e71);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1e9a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e98,"merge",&local_1e99);
  ActionHideShadow::ActionHideShadow((ActionHideShadow *)pAVar3,(string *)local_1e98);
  local_1e9a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1e98);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e99);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1ec2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ec0,"merge",&local_1ec1);
  ActionCopyMarker::ActionCopyMarker((ActionCopyMarker *)pAVar3,(string *)local_1ec0);
  local_1ec2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ec1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1eea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ee8,"localrecovery",&local_1ee9);
  ActionOutputPrototype::ActionOutputPrototype((ActionOutputPrototype *)pAVar3,(string *)local_1ee8)
  ;
  local_1eea = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1ee8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ee9);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1f12 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f10,"fixateproto",&local_1f11);
  ActionInputPrototype::ActionInputPrototype((ActionInputPrototype *)pAVar3,(string *)local_1f10);
  local_1f12 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1f10);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f11);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1f3a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f38,"localrecovery",&local_1f39);
  ActionRestructureHigh::ActionRestructureHigh((ActionRestructureHigh *)pAVar3,(string *)local_1f38)
  ;
  local_1f3a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f39);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1f62 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f60,"fixateglobals",&local_1f61);
  ActionMapGlobals::ActionMapGlobals((ActionMapGlobals *)pAVar3,(string *)local_1f60);
  local_1f62 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f61);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1f8a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f88,"dynamic",&local_1f89);
  ActionDynamicSymbols::ActionDynamicSymbols((ActionDynamicSymbols *)pAVar3,(string *)local_1f88);
  local_1f8a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1f88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f89);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1fb2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fb0,"merge",&local_1fb1);
  ActionNameVars::ActionNameVars((ActionNameVars *)pAVar3,(string *)local_1fb0);
  local_1fb2 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fb1);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_1fda = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fd8,"casts",&local_1fd9);
  ActionSetCasts::ActionSetCasts((ActionSetCasts *)pAVar3,(string *)local_1fd8);
  local_1fda = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_1fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fd9);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_2002 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2000,"blockrecovery",&local_2001);
  ActionFinalStructure::ActionFinalStructure((ActionFinalStructure *)pAVar3,(string *)local_2000);
  local_2002 = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_2000);
  std::allocator<char>::~allocator((allocator<char> *)&local_2001);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  local_202a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2028,"protorecovery",&local_2029);
  ActionPrototypeWarnings::ActionPrototypeWarnings
            ((ActionPrototypeWarnings *)pAVar3,(string *)local_2028);
  local_202a = 0;
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_2028);
  std::allocator<char>::~allocator((allocator<char> *)&local_2029);
  pAVar5 = actmainloop;
  pAVar3 = (Action *)operator_new(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2050,"base",&local_2051);
  ActionStop::ActionStop((ActionStop *)pAVar3,(string *)local_2050);
  ActionGroup::addAction(pAVar5,pAVar3);
  std::__cxx11::string::~string(local_2050);
  std::allocator<char>::~allocator((allocator<char> *)&local_2051);
  return;
}

Assistant:

void universal_action(Architecture *conf)

{
  vector<Rule *>::iterator iter;
  ActionGroup *act;
  ActionGroup *actmainloop;
  ActionGroup *actfullloop;
  ActionPool *actprop,*actprop2;
  ActionPool *actcleanup;
  ActionGroup *actstackstall;
  AddrSpace *stackspace = conf->getStackSpace();

  build_defaultactions(conf->allacts);
  act = new ActionRestartGroup(Action::rule_onceperfunc,"universal",1);
  conf->allacts.registerUniversal(act);

  act->addAction( new ActionStart("base"));
  act->addAction( new ActionConstbase("base"));
  act->addAction( new ActionNormalizeSetup("normalanalysis"));
  act->addAction( new ActionDefaultParams("base"));
  //  act->addAction( new ActionParamShiftStart("paramshift") );
  act->addAction( new ActionExtraPopSetup("base",stackspace) );
  act->addAction( new ActionPrototypeTypes("protorecovery"));
  act->addAction( new ActionFuncLink("protorecovery") );
  act->addAction( new ActionFuncLinkOutOnly("noproto") );
  {
    actfullloop = new ActionGroup(Action::rule_repeatapply,"fullloop");
    {
      actmainloop = new ActionGroup(Action::rule_repeatapply,"mainloop");
      actmainloop->addAction( new ActionUnreachable("base") );
      actmainloop->addAction( new ActionVarnodeProps("base") );
      actmainloop->addAction( new ActionHeritage("base") );
      actmainloop->addAction( new ActionParamDouble("protorecovery") );
      actmainloop->addAction( new ActionSegmentize("base"));
      actmainloop->addAction( new ActionForceGoto("blockrecovery") );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
      actmainloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
      actmainloop->addAction( new ActionActiveParam("protorecovery") );
      actmainloop->addAction( new ActionReturnRecovery("protorecovery") );
      //      actmainloop->addAction( new ActionParamShiftStop("paramshift") );
      actmainloop->addAction( new ActionRestrictLocal("localrecovery") ); // Do before dead code removed
      actmainloop->addAction( new ActionDeadCode("deadcode") );
      actmainloop->addAction( new ActionDynamicMapping("dynamic") ); // Must come before restructurevarnode and infertypes
      actmainloop->addAction( new ActionRestructureVarnode("localrecovery") );
      actmainloop->addAction( new ActionSpacebase("base") );	// Must come before infertypes and nonzeromask
      actmainloop->addAction( new ActionNonzeroMask("analysis") );
      actmainloop->addAction( new ActionInferTypes("typerecovery") );
      actstackstall = new ActionGroup(Action::rule_repeatapply,"stackstall");
      {
	actprop = new ActionPool(Action::rule_repeatapply,"oppool1");
	actprop->addRule( new RuleEarlyRemoval("deadcode"));
	actprop->addRule( new RuleTermOrder("analysis"));
	actprop->addRule( new RuleSelectCse("analysis"));
	actprop->addRule( new RuleCollectTerms("analysis"));
	actprop->addRule( new RulePullsubMulti("analysis"));
	actprop->addRule( new RulePullsubIndirect("analysis"));
	actprop->addRule( new RulePushMulti("nodejoin"));
	actprop->addRule( new RuleSborrow("analysis") );
	actprop->addRule( new RuleIntLessEqual("analysis") );
	actprop->addRule( new RuleTrivialArith("analysis") );
	actprop->addRule( new RuleTrivialBool("analysis") );
	actprop->addRule( new RuleTrivialShift("analysis") );
	actprop->addRule( new RuleSignShift("analysis") );
	actprop->addRule( new RuleTestSign("analysis") );
	actprop->addRule( new RuleIdentityEl("analysis") );
	actprop->addRule( new RuleOrMask("analysis") );
	actprop->addRule( new RuleAndMask("analysis") );
	actprop->addRule( new RuleOrConsume("analysis") );
	actprop->addRule( new RuleOrCollapse("analysis") );
	actprop->addRule( new RuleAndOrLump("analysis") );
	actprop->addRule( new RuleShiftBitops("analysis") );
	actprop->addRule( new RuleRightShiftAnd("analysis") );
	actprop->addRule( new RuleNotDistribute("analysis") );
	actprop->addRule( new RuleHighOrderAnd("analysis") );
	actprop->addRule( new RuleAndDistribute("analysis") );
	actprop->addRule( new RuleAndCommute("analysis") );
	actprop->addRule( new RuleAndPiece("analysis") );
	actprop->addRule( new RuleAndCompare("analysis") );
	actprop->addRule( new RuleDoubleSub("analysis") );
	actprop->addRule( new RuleDoubleShift("analysis") );
	actprop->addRule( new RuleDoubleArithShift("analysis") );
	actprop->addRule( new RuleConcatShift("analysis") );
	actprop->addRule( new RuleLeftRight("analysis") );
	actprop->addRule( new RuleShiftCompare("analysis") );
	actprop->addRule( new RuleShift2Mult("analysis") );
	actprop->addRule( new RuleShiftPiece("analysis") );
	actprop->addRule( new RuleMultiCollapse("analysis") );
	actprop->addRule( new RuleIndirectCollapse("analysis") );
	actprop->addRule( new Rule2Comp2Mult("analysis") );
	actprop->addRule( new RuleSub2Add("analysis") );
	actprop->addRule( new RuleCarryElim("analysis") );
	actprop->addRule( new RuleBxor2NotEqual("analysis") );
	actprop->addRule( new RuleLess2Zero("analysis") );
	actprop->addRule( new RuleLessEqual2Zero("analysis") );
	actprop->addRule( new RuleSLess2Zero("analysis") );
	actprop->addRule( new RuleEqual2Zero("analysis") );
	actprop->addRule( new RuleEqual2Constant("analysis") );
	actprop->addRule( new RuleThreeWayCompare("analysis") );
	actprop->addRule( new RuleXorCollapse("analysis") );
	actprop->addRule( new RuleAddMultCollapse("analysis") );
	actprop->addRule( new RuleCollapseConstants("analysis") );
	actprop->addRule( new RuleTransformCpool("analysis") );
	actprop->addRule( new RulePropagateCopy("analysis") );
	actprop->addRule( new RuleZextEliminate("analysis") );
	actprop->addRule( new RuleSlessToLess("analysis") );
	actprop->addRule( new RuleZextSless("analysis") );
	actprop->addRule( new RuleBitUndistribute("analysis") );
	actprop->addRule( new RuleBoolZext("analysis") );
	actprop->addRule( new RuleBooleanNegate("analysis") );
	actprop->addRule( new RuleLogic2Bool("analysis") );
	actprop->addRule( new RuleSubExtComm("analysis") );
	actprop->addRule( new RuleSubCommute("analysis") );
	actprop->addRule( new RuleConcatCommute("analysis") );
	actprop->addRule( new RuleConcatZext("analysis") );
	actprop->addRule( new RuleZextCommute("analysis") );
	actprop->addRule( new RuleZextShiftZext("analysis") );
	actprop->addRule( new RuleShiftAnd("analysis") );
	actprop->addRule( new RuleConcatZero("analysis") );
	actprop->addRule( new RuleConcatLeftShift("analysis") );
	actprop->addRule( new RuleEmbed("analysis") );
	actprop->addRule( new RuleSubZext("analysis") );
	actprop->addRule( new RuleSubCancel("analysis") );
	actprop->addRule( new RuleShiftSub("analysis") );
	actprop->addRule( new RuleHumptyDumpty("analysis") );
	actprop->addRule( new RuleDumptyHump("analysis") );
	actprop->addRule( new RuleHumptyOr("analysis") );
	actprop->addRule( new RuleNegateIdentity("analysis") );
	actprop->addRule( new RuleSubNormal("analysis") );
	actprop->addRule( new RulePositiveDiv("analysis") );
	actprop->addRule( new RuleDivTermAdd("analysis") );
	actprop->addRule( new RuleDivTermAdd2("analysis") );
	actprop->addRule( new RuleDivOpt("analysis") );
	actprop->addRule( new RuleSignForm("analysis") );
	actprop->addRule( new RuleSignDiv2("analysis") );
	actprop->addRule( new RuleSignNearMult("analysis") );
	actprop->addRule( new RuleModOpt("analysis") );
	actprop->addRule( new RuleSwitchSingle("analysis") );
	actprop->addRule( new RuleCondNegate("analysis") );
	actprop->addRule( new RuleBoolNegate("analysis") );
	actprop->addRule( new RuleLessEqual("analysis") );
	actprop->addRule( new RuleLessNotEqual("analysis") );
	actprop->addRule( new RuleLessOne("analysis") );
	actprop->addRule( new RuleRangeMeld("analysis") );
	actprop->addRule( new RuleFloatRange("analysis") );
	actprop->addRule( new RulePiece2Zext("analysis") );
	actprop->addRule( new RulePiece2Sext("analysis") );
	actprop->addRule( new RuleSubvarAnd("subvar") );
	actprop->addRule( new RuleSubvarSubpiece("subvar") );
	actprop->addRule( new RuleSplitFlow("subvar") );
	actprop->addRule( new RulePtrFlow("subvar",conf) );
	actprop->addRule( new RuleSubvarCompZero("subvar") );
	actprop->addRule( new RuleSubvarShift("subvar") );
	actprop->addRule( new RuleSubvarZext("subvar") );
	actprop->addRule( new RuleSubvarSext("subvar") );
	actprop->addRule( new RuleNegateNegate("analysis") );
	actprop->addRule( new RuleConditionalMove("conditionalexe") );
	actprop->addRule( new RuleOrPredicate("conditionalexe") );
	actprop->addRule( new RuleFuncPtrEncoding("analysis") );
	actprop->addRule( new RuleSubfloatConvert("floatprecision") );
	actprop->addRule( new RuleFloatCast("floatprecision") );
	actprop->addRule( new RuleIgnoreNan("floatprecision") );
	actprop->addRule( new RulePtraddUndo("typerecovery") );
	actprop->addRule( new RulePtrsubUndo("typerecovery") );
	actprop->addRule( new RuleSegment("segment") );

	actprop->addRule( new RuleDoubleLoad("doubleload") );
	actprop->addRule( new RuleDoubleIn("doubleprecis") );
	for(iter=conf->extra_pool_rules.begin();iter!=conf->extra_pool_rules.end();++iter)
	  actprop->addRule( *iter ); // Add CPU specific rules
	conf->extra_pool_rules.clear(); // Rules are now absorbed into universal
      }
      actstackstall->addAction( actprop );
      actstackstall->addAction( new ActionMultiCse("analysis") );
      actstackstall->addAction( new ActionShadowVar("analysis") );
      actstackstall->addAction( new ActionDeindirect("deindirect") );
      actstackstall->addAction( new ActionStackPtrFlow("stackptrflow",stackspace));
      actmainloop->addAction( actstackstall );
      actmainloop->addAction( new ActionRedundBranch("deadcontrolflow") ); // dead code removal
      actmainloop->addAction( new ActionBlockStructure("blockrecovery"));
      actmainloop->addAction( new ActionConstantPtr("typerecovery") );
      {
	actprop2 = new ActionPool(Action::rule_repeatapply,"oppool2");

	actprop2->addRule( new RulePushPtr("typerecovery") );
	actprop2->addRule( new RuleStructOffset0("typerecovery") );
	actprop2->addRule( new RulePtrArith("typerecovery") );
	//	actprop2->addRule( new RuleIndirectConcat("analysis") );
	actprop2->addRule( new RuleLoadVarnode("stackvars") );
	actprop2->addRule( new RuleStoreVarnode("stackvars") );
      }
      actmainloop->addAction( actprop2 );
      actmainloop->addAction( new ActionDeterminedBranch("unreachable") );
      actmainloop->addAction( new ActionUnreachable("unreachable") );
      actmainloop->addAction( new ActionNodeJoin("nodejoin") );
      actmainloop->addAction( new ActionConditionalExe("conditionalexe") );
      actmainloop->addAction( new ActionConditionalConst("analysis") );
    }
    actfullloop->addAction( actmainloop );
    actfullloop->addAction( new ActionLikelyTrash("protorecovery") );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_a", true) );
    actfullloop->addAction( new ActionDirectWrite("protorecovery_b", false) );
    actfullloop->addAction( new ActionDeadCode("deadcode") );
    actfullloop->addAction( new ActionDoNothing("deadcontrolflow") );
    actfullloop->addAction( new ActionSwitchNorm("switchnorm") );
    actfullloop->addAction( new ActionReturnSplit("returnsplit") );
    actfullloop->addAction( new ActionUnjustifiedParams("protorecovery") );
    actfullloop->addAction( new ActionStartTypes("typerecovery") );
    actfullloop->addAction( new ActionActiveReturn("protorecovery") );
  }
  act->addAction( actfullloop );
  act->addAction( new ActionStartCleanUp("cleanup") );
  {
    actcleanup = new ActionPool(Action::rule_repeatapply,"cleanup");

    actcleanup->addRule( new RuleMultNegOne("cleanup") );
    actcleanup->addRule( new RuleAddUnsigned("cleanup") );
    actcleanup->addRule( new Rule2Comp2Sub("cleanup") );
    actcleanup->addRule( new RuleSubRight("cleanup") );
    actcleanup->addRule( new RulePtrsubCharConstant("cleanup") );
  }
  act->addAction( actcleanup );

  act->addAction( new ActionPreferComplement("blockrecovery") );
  act->addAction( new ActionNormalizeBranches("normalizebranches") );
  act->addAction( new ActionAssignHigh("merge") );
  act->addAction( new ActionMergeRequired("merge") );
  act->addAction( new ActionMarkExplicit("merge") );
  act->addAction( new ActionMarkImplied("merge") ); // This must come BEFORE general merging
  act->addAction( new ActionMergeCopy("merge") );
  act->addAction( new ActionDominantCopy("merge") );
  act->addAction( new ActionMarkIndirectOnly("merge") ); // Must come after required merges but before speculative
  act->addAction( new ActionMergeAdjacent("merge") );
  act->addAction( new ActionMergeType("merge") );
  act->addAction( new ActionHideShadow("merge") );
  act->addAction( new ActionCopyMarker("merge") );
  act->addAction( new ActionOutputPrototype("localrecovery") );
  act->addAction( new ActionInputPrototype("fixateproto") );
  act->addAction( new ActionRestructureHigh("localrecovery") );
  act->addAction( new ActionMapGlobals("fixateglobals") );
  act->addAction( new ActionDynamicSymbols("dynamic") );
  act->addAction( new ActionNameVars("merge") );
  act->addAction( new ActionSetCasts("casts") );
  act->addAction( new ActionFinalStructure("blockrecovery") );
  act->addAction( new ActionPrototypeWarnings("protorecovery") );
  act->addAction( new ActionStop("base") );
}